

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator
          (JavascriptStaticEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  int iVar1;
  JavascriptEnumerator **ppJVar2;
  JavascriptEnumerator *pJVar3;
  undefined4 extraout_var;
  nullptr_t local_40;
  WriteBarrierPtr<Js::JavascriptEnumerator> local_38;
  JavascriptString *local_30;
  JavascriptString *currentIndex;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptStaticEnumerator *this_local;
  
  currentIndex = (JavascriptString *)attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)this;
  while( true ) {
    ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptEnumerator__
                        ((WriteBarrierPtr *)&this->currentEnumerator);
    if (*ppJVar2 == (JavascriptEnumerator *)0x0) {
      return (JavascriptString *)0x0;
    }
    pJVar3 = Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator->(&this->currentEnumerator)
    ;
    iVar1 = (*(pJVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[99])(pJVar3,attributes_local,currentIndex);
    local_30 = (JavascriptString *)CONCAT44(extraout_var,iVar1);
    if (local_30 != (JavascriptString *)0x0) break;
    ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptEnumerator__
                        ((WriteBarrierPtr *)&this->currentEnumerator);
    pJVar3 = *ppJVar2;
    ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptEnumerator__
                        ((WriteBarrierPtr *)&this->prefixEnumerator);
    if (pJVar3 == *ppJVar2) {
      Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierPtr
                (&local_38,&this->arrayEnumerator);
    }
    else {
      local_40 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierPtr(&local_38,&local_40);
    }
    Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=(&this->currentEnumerator,&local_38)
    ;
  }
  return local_30;
}

Assistant:

JavascriptString * JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        while (this->currentEnumerator)
        {
            JavascriptString * currentIndex = this->currentEnumerator->MoveAndGetNext(propertyId, attributes);
            if (currentIndex != nullptr)
            {
                return currentIndex;
            }
            this->currentEnumerator = (this->currentEnumerator == this->prefixEnumerator) ? this->arrayEnumerator : nullptr;
        }

        return nullptr;
    }